

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

bool Jupiter::Database::Data::process_file(Database *db)

{
  bool bVar1;
  FILE *__stream;
  
  __stream = fopen((db->data_->file_name)._M_dataplus._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    if (db->data_->auto_create == true) {
      __stream = fopen((db->data_->file_name)._M_dataplus._M_p,"wb");
      if (__stream != (FILE *)0x0) {
        (*db->_vptr_Database[2])(db,__stream);
        (*db->_vptr_Database[3])(db,__stream);
        goto LAB_00125f7c;
      }
    }
    bVar1 = false;
  }
  else {
    Database::process_file(db,(FILE *)__stream);
LAB_00125f7c:
    fclose(__stream);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Jupiter::Database::Data::process_file(Jupiter::Database *db)
{
	FILE *file = fopen(db->data_->file_name.c_str(), "rb");
	if (file == nullptr)
	{
		if (db->data_->auto_create)
		{
			file = fopen(db->data_->file_name.c_str(), "wb");
			if (file != nullptr)
			{
				db->create_header(file);
				db->process_file_finish(file);
				fclose(file);
				return true;
			}
		}
		return false;
	}
	bool r = db->process_file(file);
	fclose(file);
	return r;
}